

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O1

barindex __thiscall BmsUtil::LCM(BmsUtil *this,barindex x,barindex y)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  iVar6 = (int)this;
  iVar1 = 0;
  if (x != 0 && iVar6 != 0) {
    uVar4 = (ulong)(uint)-iVar6;
    if (0 < iVar6) {
      uVar4 = (ulong)this & 0xffffffff;
    }
    uVar3 = (uint)uVar4;
    uVar5 = -x;
    if (0 < x) {
      uVar5 = x;
    }
    if (uVar3 != uVar5) {
      do {
        iVar2 = (int)uVar4;
        iVar1 = iVar2;
        uVar3 = 0;
        if ((int)uVar5 < iVar2) {
          iVar1 = 0;
          uVar3 = uVar5;
        }
        uVar3 = iVar2 - uVar3;
        uVar4 = (ulong)uVar3;
        uVar5 = uVar5 - iVar1;
      } while (uVar3 != uVar5);
    }
    iVar1 = (x * iVar6) / (int)uVar3;
  }
  return iVar1;
}

Assistant:

barindex
BmsUtil::LCM(barindex x, barindex y)
{
	if (x == 0 || y == 0) { return 0; }
	return x * y / BmsUtil::GCD(x, y);
}